

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O3

void __thiscall cmCPackGeneratorFactory::~cmCPackGeneratorFactory(cmCPackGeneratorFactory *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackGeneratorFactory_0060c3e0;
  ppcVar1 = (this->Generators).
            super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (this->Generators).
                 super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1) {
    if (*ppcVar2 != (cmCPackGenerator *)0x0) {
      (*((*ppcVar2)->super_cmObject)._vptr_cmObject[1])();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->GeneratorDescriptions)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>_>
  ::~_Rb_tree(&(this->GeneratorCreators)._M_t);
  ppcVar2 = (this->Generators).
            super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->Generators).
                                  super__Vector_base<cmCPackGenerator_*,_std::allocator<cmCPackGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
    return;
  }
  return;
}

Assistant:

cmCPackGeneratorFactory::~cmCPackGeneratorFactory()
{
  cmDeleteAll(this->Generators);
}